

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_conn_forget_socket(Curl_easy *data,int sockindex)

{
  Curl_cfilter *cf_00;
  Curl_cfilter *cf;
  int sockindex_local;
  Curl_easy *data_local;
  
  if (data->conn != (connectdata *)0x0) {
    cf_00 = data->conn->cfilter[sockindex];
    if (cf_00 != (Curl_cfilter *)0x0) {
      Curl_conn_cf_cntrl(cf_00,data,true,0x101,0,(void *)0x0);
    }
    data->conn->sock[sockindex] = -1;
  }
  return;
}

Assistant:

void Curl_conn_forget_socket(struct Curl_easy *data, int sockindex)
{
  if(data->conn) {
    struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
    if(cf)
      (void)Curl_conn_cf_cntrl(cf, data, TRUE,
                               CF_CTRL_FORGET_SOCKET, 0, NULL);
    fake_sclose(data->conn->sock[sockindex]);
    data->conn->sock[sockindex] = CURL_SOCKET_BAD;
  }
}